

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariableInterface
          (ValidatorImpl *this,VariablePtr *variable,VariableMap *alreadyReported)

{
  IssueImpl *pIVar1;
  shared_ptr<libcellml::VariablePair> *psVar2;
  EntityImpl *this_00;
  bool bVar3;
  InterfaceType interfaceTypeMinimumRequired;
  undefined8 *puVar4;
  size_t sVar5;
  long *plVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  long *plVar9;
  element_type *peVar10;
  ulong *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  ulong uVar15;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it_00;
  long lVar16;
  string interfaceTypeString;
  VariablePtr equivalentVariable;
  IssuePtr err;
  IssuePtr err_1;
  ComponentPtr equivalentComponent;
  string componentName;
  ComponentPtr component;
  VariablePairPtr pair;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  string local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  string local_198;
  Variable local_178;
  element_type local_158;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_130;
  IssuePtr local_120;
  ParentedEntityConstPtr local_110;
  string local_100;
  ValidatorImpl *local_e0;
  shared_ptr<libcellml::VariablePair> *local_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  ParentedEntityConstPtr local_70;
  string local_60;
  value_type local_40;
  
  local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)alreadyReported;
  local_e0 = this;
  interfaceTypeMinimumRequired = determineInterfaceType(variable);
  local_2b8._M_dataplus._M_p =
       (pointer)(variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  local_2b8._M_string_length =
       (size_type)
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->
           _M_use_count + 1;
    }
  }
  owningComponent(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
  }
  NamedEntity::name_abi_cxx11_
            (&local_100,
             (NamedEntity *)
             local_70.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if (interfaceTypeMinimumRequired == NONE) {
    uVar15 = 0;
    while( true ) {
      sVar5 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if (sVar5 <= uVar15) break;
      Variable::equivalentVariable
                (&local_178,
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      local_2b8._M_dataplus._M_p =
           (pointer)local_178.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
      local_2b8._M_string_length =
           (size_type)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
               *(_Atomic_word *)
                ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1
          ;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
               *(_Atomic_word *)
                ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1
          ;
        }
      }
      owningComponent(&local_110);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
      }
      if ((local_110.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != (element_type *)0x0) &&
         (bVar3 = reachableEquivalence(variable,(VariablePtr *)&local_178),
         this_00 = local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl, !bVar3)) {
        __it_00._M_current =
             (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                *)&(local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                    super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_NamedEntity)->_M_impl).super__Vector_impl_data._M_start;
        psVar2 = (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                    *)&(local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                        super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_NamedEntity)->_M_impl).super__Vector_impl_data._M_finish;
        local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_178.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        local_288._M_allocated_capacity =
             (size_type)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_288._8_8_ =
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
        }
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
        }
        local_278._M_dataplus._M_p =
             (pointer)local_178.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_278._M_string_length =
             (size_type)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        local_278.field_2._M_allocated_capacity = local_288._M_allocated_capacity;
        local_278.field_2._8_8_ = local_288._8_8_;
        local_80 = (element_type *)local_288._M_allocated_capacity;
        local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        local_2b8._M_dataplus._M_p = local_278._M_dataplus._M_p;
        local_2b8._M_string_length = local_278._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_278._M_string_length + 8) =
                 *(_Atomic_word *)(local_278._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_278._M_string_length + 8) =
                 *(_Atomic_word *)(local_278._M_string_length + 8) + 1;
          }
        }
        local_2b8.field_2._M_allocated_capacity = local_278.field_2._M_allocated_capacity;
        local_2b8.field_2._8_8_ = local_278.field_2._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_278.field_2._8_8_ + 8) =
                 *(_Atomic_word *)(local_278.field_2._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_278.field_2._8_8_ + 8) =
                 *(_Atomic_word *)(local_278.field_2._8_8_ + 8) + 1;
          }
        }
        lVar16 = (long)psVar2 - (long)__it_00._M_current;
        local_d8 = psVar2;
        if (0 < lVar16 >> 6) {
          lVar7 = (lVar16 >> 6) + 1;
          do {
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00);
            __it._M_current = __it_00._M_current;
            if (bVar3) goto LAB_00276d9a;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00._M_current + 1);
            __it._M_current = __it_00._M_current + 1;
            if (bVar3) goto LAB_00276d9a;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00._M_current + 2);
            __it._M_current = __it_00._M_current + 2;
            if (bVar3) goto LAB_00276d9a;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00._M_current + 3);
            __it._M_current = __it_00._M_current + 3;
            if (bVar3) goto LAB_00276d9a;
            __it_00._M_current = __it_00._M_current + 4;
            lVar7 = lVar7 + -1;
            lVar16 = lVar16 + -0x40;
          } while (1 < lVar7);
        }
        lVar16 = lVar16 >> 4;
        if (lVar16 == 1) {
LAB_00276d81:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&local_2b8,__it_00);
          __it._M_current = local_d8;
          if (bVar3) {
            __it._M_current = __it_00._M_current;
          }
        }
        else {
          __it._M_current = __it_00._M_current;
          if (lVar16 == 2) {
LAB_00276d4f:
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it);
            if (!bVar3) {
              __it_00._M_current = __it._M_current + 1;
              goto LAB_00276d81;
            }
          }
          else {
            __it._M_current = local_d8;
            if ((lVar16 == 3) &&
               (bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)&local_2b8,__it_00), __it._M_current = __it_00._M_current,
               !bVar3)) {
              __it._M_current = __it_00._M_current + 1;
              goto LAB_00276d4f;
            }
          }
        }
LAB_00276d9a:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8.field_2._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.field_2._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        if (__it._M_current ==
            (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
               *)&(local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                   super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_NamedEntity)->_M_impl).super__Vector_impl_data._M_finish) {
          VariablePair::create((VariablePair *)&local_40,variable,(VariablePtr *)&local_178);
          std::
          vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
          ::push_back((vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                       *)local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                         super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &local_40);
          NamedEntity::name_abi_cxx11_
                    (&local_2b8,
                     (NamedEntity *)
                     local_110.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          Issue::IssueImpl::create();
          pIVar1 = (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_60,
                     &((variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_NamedEntity);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x2a8fb3);
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar6 + 2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar6 == p_Var8) {
            local_130._vptr__Sp_counted_base = p_Var8->_vptr__Sp_counted_base;
            local_130._8_8_ = plVar6[3];
            local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 &local_130;
          }
          else {
            local_130._vptr__Sp_counted_base = p_Var8->_vptr__Sp_counted_base;
            local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar6;
          }
          local_138 = plVar6[1];
          *plVar6 = (long)p_Var8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append
                                     ((char *)&local_158.
                                               super_enable_shared_from_this<libcellml::Variable>.
                                               _M_weak_this.
                                               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount);
          local_b0 = &local_a0;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_a0 = *plVar9;
            lStack_98 = plVar6[3];
          }
          else {
            local_a0 = *plVar9;
            local_b0 = (long *)*plVar6;
          }
          local_a8 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b0,(ulong)local_100._M_dataplus._M_p);
          local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
          super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_158;
          peVar10 = (element_type *)(plVar6 + 2);
          if ((element_type *)*plVar6 == peVar10) {
            local_158.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                 (peVar10->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_158.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                 (EntityImpl *)plVar6[3];
          }
          else {
            local_158.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                 (peVar10->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar6;
          }
          local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
          super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)peVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append
                                     ((char *)&local_178.
                                               super_enable_shared_from_this<libcellml::Variable>);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          puVar11 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_198.field_2._M_allocated_capacity = *puVar11;
            local_198.field_2._8_8_ = plVar6[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *puVar11;
            local_198._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_198._M_string_length = plVar6[1];
          *plVar6 = (long)puVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_d0,
                     (NamedEntity *)
                     local_178.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity);
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar13 = local_198.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_d0._M_string_length + local_198._M_string_length) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar13 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_d0._M_string_length + local_198._M_string_length)
            goto LAB_002770c1;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_d0,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
          }
          else {
LAB_002770c1:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_198,(ulong)local_d0._M_dataplus._M_p);
          }
          local_1b8 = &local_1a8;
          plVar6 = puVar4 + 2;
          if ((long *)*puVar4 == plVar6) {
            local_1a8 = *plVar6;
            uStack_1a0 = puVar4[3];
          }
          else {
            local_1a8 = *plVar6;
            local_1b8 = (long *)*puVar4;
          }
          local_1b0 = puVar4[1];
          *puVar4 = plVar6;
          puVar4[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          puVar11 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_1f8.field_2._M_allocated_capacity = *puVar11;
            local_1f8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *puVar11;
            local_1f8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1f8._M_string_length = plVar6[1];
          *plVar6 = (long)puVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1f8,(ulong)local_2b8._M_dataplus._M_p);
          local_258 = &local_248;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_248 = *plVar9;
            lStack_240 = plVar6[3];
          }
          else {
            local_248 = *plVar9;
            local_258 = (long *)*plVar6;
          }
          local_250 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
          local_238 = &local_228;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_228 = *plVar9;
            lStack_220 = plVar6[3];
          }
          else {
            local_228 = *plVar9;
            local_238 = (long *)*plVar6;
          }
          local_230 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_238,(ulong)local_100._M_dataplus._M_p);
          local_1d8 = &local_1c8;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_1c8 = *plVar9;
            lStack_1c0 = plVar6[3];
          }
          else {
            local_1c8 = *plVar9;
            local_1d8 = (long *)*plVar6;
          }
          local_1d0 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
          local_218 = &local_208;
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_208 = *plVar9;
            lStack_200 = plVar6[3];
          }
          else {
            local_208 = *plVar9;
            local_218 = (long *)*plVar6;
          }
          local_210 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_218,(ulong)local_2b8._M_dataplus._M_p);
          local_298 = &local_288;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar12) {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._8_8_ = plVar6[3];
          }
          else {
            local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6;
          }
          local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)paVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar12) {
            local_278.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_278.field_2._8_8_ = plVar6[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_278._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_278._M_string_length = plVar6[1];
          *plVar6 = (long)paVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          if (local_298 != &local_288) {
            operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
          }
          if (local_218 != &local_208) {
            operator_delete(local_218,local_208 + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if (local_238 != &local_228) {
            operator_delete(local_238,local_228 + 1);
          }
          if (local_258 != &local_248) {
            operator_delete(local_258,local_248 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_158
             ) {
            operator_delete(local_178.super_enable_shared_from_this<libcellml::Variable>.
                            _M_weak_this.
                            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,(long)local_158.super_NamedEntity.super_ParentedEntity.super_Entity.
                                   _vptr_Entity + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_158.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              &local_130) {
            operator_delete(local_158.super_enable_shared_from_this<libcellml::Variable>.
                            _M_weak_this.
                            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(long)local_130._vptr__Sp_counted_base + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                    ((((local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,variable,(VariablePtr *)&local_178);
          Issue::IssueImpl::setReferenceRule
                    ((local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,MAP_VARIABLES_ELEMENT);
          Logger::LoggerImpl::addIssue(&local_e0->super_LoggerImpl,&local_120);
          if (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,
                            (ulong)(local_2b8.field_2._M_allocated_capacity + 1));
          }
          if (local_40.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.
                       super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      if (local_110.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      uVar15 = uVar15 + 1;
    }
    goto LAB_00277ec0;
  }
  Variable::interfaceType_abi_cxx11_
            (&local_2b8,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  bVar3 = interfaceTypeIsCompatible(interfaceTypeMinimumRequired,&local_2b8);
  if (!bVar3) {
    Issue::IssueImpl::create();
    pIVar1 = (IssueImpl *)
             ((local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      NamedEntity::name_abi_cxx11_
                (&local_1f8,
                 &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_NamedEntity);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x28fa35);
      local_258 = &local_248;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_248 = *plVar9;
        lStack_240 = plVar6[3];
      }
      else {
        local_248 = *plVar9;
        local_258 = (long *)*plVar6;
      }
      local_250 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_238 = &local_228;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_228 = *plVar9;
        lStack_220 = plVar6[3];
      }
      else {
        local_228 = *plVar9;
        local_238 = (long *)*plVar6;
      }
      local_230 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_238,(ulong)local_100._M_dataplus._M_p);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_1c8 = *plVar9;
        lStack_1c0 = plVar6[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar9;
        local_1d8 = (long *)*plVar6;
      }
      local_1d0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_208 = *plVar9;
        lStack_200 = plVar6[3];
        local_218 = &local_208;
      }
      else {
        local_208 = *plVar9;
        local_218 = (long *)*plVar6;
      }
      local_210 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (libcellml::interfaceTypeToString_abi_cxx11_._16_8_ == 0) {
        lVar16 = 0x2ed6e8;
      }
      else {
        lVar7 = 0x2ed6e8;
        lVar16 = libcellml::interfaceTypeToString_abi_cxx11_._16_8_;
        do {
          if ((int)interfaceTypeMinimumRequired <= *(int *)(lVar16 + 0x20)) {
            lVar7 = lVar16;
          }
          lVar16 = *(long *)(lVar16 + 0x10 +
                            (ulong)(*(int *)(lVar16 + 0x20) < (int)interfaceTypeMinimumRequired) * 8
                            );
        } while (lVar16 != 0);
        lVar16 = 0x2ed6e8;
        if ((lVar7 != 0x2ed6e8) &&
           (lVar16 = 0x2ed6e8, *(int *)(lVar7 + 0x20) <= (int)interfaceTypeMinimumRequired)) {
          lVar16 = lVar7;
        }
      }
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_218,*(ulong *)(lVar16 + 0x28))
      ;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_288._8_8_ = plVar6[3];
        local_298 = &local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_278.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar1,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        (ulong)(local_278.field_2._M_allocated_capacity + 1));
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      uVar13 = local_1f8.field_2._M_allocated_capacity;
      _Var14._M_p = local_1f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_00277e45;
    }
    else {
      NamedEntity::name_abi_cxx11_
                (&local_198,
                 &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_NamedEntity);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x28fa35)
      ;
      local_1b8 = &local_1a8;
      plVar6 = puVar4 + 2;
      if ((long *)*puVar4 == plVar6) {
        local_1a8 = *plVar6;
        uStack_1a0 = puVar4[3];
      }
      else {
        local_1a8 = *plVar6;
        local_1b8 = (long *)*puVar4;
      }
      local_1b0 = puVar4[1];
      *puVar4 = plVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_1f8.field_2._M_allocated_capacity = *puVar11;
        local_1f8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *puVar11;
        local_1f8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1f8._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1f8,(ulong)local_100._M_dataplus._M_p);
      local_258 = &local_248;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_248 = *plVar9;
        lStack_240 = plVar6[3];
      }
      else {
        local_248 = *plVar9;
        local_258 = (long *)*plVar6;
      }
      local_250 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_238 = &local_228;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_228 = *plVar9;
        lStack_220 = plVar6[3];
      }
      else {
        local_228 = *plVar9;
        local_238 = (long *)*plVar6;
      }
      local_230 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_238,(ulong)local_2b8._M_dataplus._M_p);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_1c8 = *plVar9;
        lStack_1c0 = plVar6[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar9;
        local_1d8 = (long *)*plVar6;
      }
      local_1d0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_208 = *plVar9;
        lStack_200 = plVar6[3];
        local_218 = &local_208;
      }
      else {
        local_208 = *plVar9;
        local_218 = (long *)*plVar6;
      }
      local_210 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (libcellml::interfaceTypeToString_abi_cxx11_._16_8_ == 0) {
        lVar16 = 0x2ed6e8;
      }
      else {
        lVar7 = 0x2ed6e8;
        lVar16 = libcellml::interfaceTypeToString_abi_cxx11_._16_8_;
        do {
          if ((int)interfaceTypeMinimumRequired <= *(int *)(lVar16 + 0x20)) {
            lVar7 = lVar16;
          }
          lVar16 = *(long *)(lVar16 + 0x10 +
                            (ulong)(*(int *)(lVar16 + 0x20) < (int)interfaceTypeMinimumRequired) * 8
                            );
        } while (lVar16 != 0);
        lVar16 = 0x2ed6e8;
        if ((lVar7 != 0x2ed6e8) &&
           (lVar16 = 0x2ed6e8, *(int *)(lVar7 + 0x20) <= (int)interfaceTypeMinimumRequired)) {
          lVar16 = lVar7;
        }
      }
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_218,*(ulong *)(lVar16 + 0x28))
      ;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_288._8_8_ = plVar6[3];
        local_298 = &local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_278.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar1,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        (ulong)(local_278.field_2._M_allocated_capacity + 1));
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,local_1a8 + 1);
      }
      uVar13 = local_198.field_2._M_allocated_capacity;
      _Var14._M_p = local_198._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
LAB_00277e45:
        operator_delete(_Var14._M_p,uVar13 + 1);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              (*(AnyCellmlElementImpl **)
                ((local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[1].mId._M_string_length,
               variable);
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               ((local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,MAP_VARIABLES_ELEMENT);
    Logger::LoggerImpl::addIssue
              (&local_e0->super_LoggerImpl,
               (IssuePtr *)&local_178.super_enable_shared_from_this<libcellml::Variable>);
    if (local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
        super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,(ulong)(local_2b8.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_00277ec0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_70.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariableInterface(const VariablePtr &variable, VariableMap &alreadyReported)
{
    Variable::InterfaceType interfaceType = determineInterfaceType(variable);
    auto component = owningComponent(variable);
    std::string componentName = component->name();
    if (interfaceType == Variable::InterfaceType::NONE) {
        for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
            const auto equivalentVariable = variable->equivalentVariable(index);
            auto equivalentComponent = owningComponent(equivalentVariable);
            if (equivalentComponent != nullptr && !reachableEquivalence(variable, equivalentVariable)) {
                auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                       [equivalentVariable, variable](const VariablePairPtr &in) {
                                           return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                       });
                if (it == alreadyReported.end()) {
                    VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                    alreadyReported.push_back(pair);
                    std::string equivalentComponentName = equivalentComponent->name();

                    IssuePtr err = Issue::IssueImpl::create();
                    err->mPimpl->setDescription("The equivalence between '" + variable->name() + "' in component '" + componentName + "'  and '" + equivalentVariable->name() + "' in component '" + equivalentComponentName + "' is invalid. Component '" + componentName + "' and '" + equivalentComponentName + "' are neither siblings nor in a parent/child relationship.");
                    err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                    err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                    addIssue(err);
                }
            }
        }
    } else {
        auto interfaceTypeString = variable->interfaceType();
        if (!interfaceTypeIsCompatible(interfaceType, interfaceTypeString)) {
            IssuePtr err = Issue::IssueImpl::create();
            if (interfaceTypeString.empty()) {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has no interface type set. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            } else {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has an interface type set to '" + interfaceTypeString + "' which is not the correct interface type for this variable. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            }
            err->mPimpl->mItem->mPimpl->setVariable(variable);
            err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
            addIssue(err);
        }
    }
}